

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O1

void s2shapeutil::AppendShapeEdges
               (S2ShapeIndex *index,S2ShapeIndexCell *cell,ShapeEdgeVector *shape_edges)

{
  uint uVar1;
  int32 iVar2;
  long lVar3;
  int iVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar7;
  size_type_conflict n;
  ulong uVar8;
  VType local_98;
  VType VStack_90;
  VType local_88;
  VType VStack_80;
  VType local_78;
  VType VStack_70;
  ShapeEdge local_68;
  long *plVar6;
  
  if (((undefined1  [16])
       (cell->shapes_).super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> &
      (undefined1  [16])0xffffff) != (undefined1  [16])0x0) {
    n = 0;
    do {
      pvVar5 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                         ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                          cell,n);
      iVar4 = (*index->_vptr_S2ShapeIndex[3])(index,(ulong)(uint)pvVar5->shape_id_);
      plVar6 = (long *)CONCAT44(extraout_var,iVar4);
      uVar1 = *(uint *)&pvVar5->field_0x4;
      if (1 < (ulong)uVar1) {
        uVar8 = 0;
        do {
          paVar7 = &pvVar5->field_3;
          if (5 < *(uint *)&pvVar5->field_0x4) {
            paVar7 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar5->field_3).edges_;
          }
          iVar2 = *(int32 *)((long)paVar7 + uVar8);
          lVar3 = plVar6[1];
          (**(code **)(*plVar6 + 0x18))(&local_98,plVar6,iVar2);
          local_68.edge_.v1.c_[1] = local_78;
          local_68.edge_.v1.c_[2] = VStack_70;
          local_68.edge_.v0.c_[2] = local_88;
          local_68.edge_.v1.c_[0] = VStack_80;
          local_68.edge_.v0.c_[0] = local_98;
          local_68.edge_.v0.c_[1] = VStack_90;
          local_68.id_.shape_id = (int32)lVar3;
          local_68.id_.edge_id = iVar2;
          absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
          ::emplace_back<s2shapeutil::ShapeEdge>(shape_edges,&local_68);
          uVar8 = uVar8 + 4;
        } while (((ulong)uVar1 * 2 & 0xfffffffffffffffc) != uVar8);
      }
      n = n + 1;
    } while (n < (*(uint *)&(cell->shapes_).
                            super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                 & 0xffffff));
  }
  return;
}

Assistant:

static void AppendShapeEdges(const S2ShapeIndex& index,
                             const S2ShapeIndexCell& cell,
                             ShapeEdgeVector* shape_edges) {
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    const S2Shape& shape = *index.shape(clipped.shape_id());
    int num_edges = clipped.num_edges();
    for (int i = 0; i < num_edges; ++i) {
      shape_edges->push_back(ShapeEdge(shape, clipped.edge(i)));
    }
  }
}